

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O2

void __thiscall
QAbstractSpinBoxPrivate::updateState(QAbstractSpinBoxPrivate *this,bool up,bool fromKeyboard)

{
  long lVar1;
  QObject *obj;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QAccessibleValueChangeEvent event;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  obj = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
  if ((int)CONCAT71(in_register_00000031,up) == 0) {
    uVar2 = this->buttonState & 0x20;
  }
  else {
    uVar2 = this->buttonState & 0x10;
  }
  if ((uVar2 == 0) && (reset(this), obj != (QObject *)0x0)) {
    uVar2 = (**(code **)(*(long *)obj + 0x1c8))(obj);
    if ((uVar2 & 2 - up) != 0) {
      this->buttonState = ((uint)!up * 0x10 - (uint)fromKeyboard) + 0x12;
      uVar3 = up - 1 | 1;
      uVar2 = uVar3 * 10;
      if ((this->stepModifier &
          (this->keyboardModifiers).super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
          super_QFlagsStorage<Qt::KeyboardModifier>.i) == NoModifier) {
        uVar2 = uVar3;
      }
      (**(code **)(*(long *)obj + 0x1b0))(obj,uVar2);
      QBasicTimer::start(&this->spinClickThresholdTimer,
                         (Duration)((long)this->spinClickThresholdTimerInterval * 1000000),obj);
      _event = &DAT_aaaaaaaaaaaaaaaa;
      QAccessibleValueChangeEvent::QAccessibleValueChangeEvent(&event,obj,&this->value);
      QAccessible::updateAccessibility((QAccessibleEvent *)&event);
      QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent(&event);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractSpinBoxPrivate::updateState(bool up, bool fromKeyboard /* = false */)
{
    Q_Q(QAbstractSpinBox);
    if ((up && (buttonState & Up)) || (!up && (buttonState & Down)))
        return;
    reset();
    if (q && (q->stepEnabled() & (up ? QAbstractSpinBox::StepUpEnabled
                                  : QAbstractSpinBox::StepDownEnabled))) {
        buttonState = (up ? Up : Down) | (fromKeyboard ? Keyboard : Mouse);
        int steps = up ? 1 : -1;
        if (keyboardModifiers & stepModifier)
            steps *= 10;
        q->stepBy(steps);
        spinClickThresholdTimer.start(spinClickThresholdTimerInterval * 1ms, q);
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(q, value);
        QAccessible::updateAccessibility(&event);
#endif
    }
}